

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall Character::Refresh(Character *this)

{
  pointer ppNVar1;
  Character *this_00;
  NPC *pNVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator iVar4;
  iterator iVar5;
  pointer psVar6;
  bool bVar7;
  list<Character_*,_std::allocator<Character_*>_> *plVar8;
  pointer ppNVar9;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar10;
  Character **ppCVar11;
  pointer psVar12;
  _List_node_base *p_Var13;
  NPC **ppNVar14;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  PacketBuilder builder;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  Character **local_d8;
  iterator iStack_d0;
  Character **local_c8;
  NPC **local_b8;
  iterator iStack_b0;
  NPC **local_a8;
  PacketBuilder local_98;
  string local_68;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> local_48;
  
  local_d8 = (Character **)0x0;
  iStack_d0._M_current = (Character **)0x0;
  local_c8 = (Character **)0x0;
  local_a8 = (NPC **)0x0;
  local_b8 = (NPC **)0x0;
  iStack_b0._M_current = (NPC **)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var13 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  plVar8 = &this->map->characters;
  if (p_Var13 != (_List_node_base *)plVar8) {
    do {
      local_98._0_8_ = p_Var13[1]._M_next;
      if ((this->nowhere == false) && (((Character *)local_98._0_8_)->nowhere == false)) {
        bVar7 = InRange(this,((Character *)local_98._0_8_)->x,((Character *)local_98._0_8_)->y);
        if (bVar7) {
          if (iStack_d0._M_current == local_c8) {
            std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
                      ((vector<Character*,std::allocator<Character*>> *)&local_d8,iStack_d0,
                       (Character **)&local_98);
          }
          else {
            *iStack_d0._M_current = (Character *)local_98._0_8_;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
      }
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != (_List_node_base *)plVar8);
  }
  ppNVar9 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar9 != ppNVar1) {
    do {
      local_98._0_8_ = *ppNVar9;
      if (this->nowhere == false) {
        bVar7 = InRange(this,*(uchar *)((long)&(((Character *)local_98._0_8_)->super_Command_Source)
                                               ._vptr_Command_Source + 2),
                        *(uchar *)((long)&(((Character *)local_98._0_8_)->super_Command_Source).
                                          _vptr_Command_Source + 3));
        if ((bVar7) && (*(bool *)(local_98._0_8_ + 0x10) == true)) {
          if (iStack_b0._M_current == local_a8) {
            std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                      ((vector<NPC*,std::allocator<NPC*>> *)&local_b8,iStack_b0,(NPC **)&local_98);
          }
          else {
            *iStack_b0._M_current = (NPC *)local_98._0_8_;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
        }
      }
      ppNVar9 = ppNVar9 + 1;
    } while (ppNVar9 != ppNVar1);
  }
  p_Var13 = (this->map->items).
            super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  plVar10 = &this->map->items;
  if (p_Var13 != (_List_node_base *)plVar10) {
    do {
      local_98._0_8_ = p_Var13[1]._M_next;
      local_98.data._M_dataplus._M_p = (pointer)p_Var13[1]._M_prev;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data._M_dataplus._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data._M_dataplus._M_p)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_98.data._M_dataplus._M_p)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data._M_dataplus._M_p)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_98.data._M_dataplus._M_p)->_M_use_count + 1;
        }
      }
      if (this->nowhere == false) {
        bVar7 = InRange(this,*(uchar *)&((Character *)local_98._0_8_)->login_time,
                        *(uchar *)((long)&((Character *)local_98._0_8_)->login_time + 1));
        if (bVar7) {
          std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
          push_back(&local_48,(value_type *)&local_98);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data._M_dataplus._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data._M_dataplus._M_p);
      }
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != (_List_node_base *)plVar10);
  }
  PacketBuilder::PacketBuilder
            (&local_98,PACKET_REFRESH,PACKET_REPLY,
             ((long)local_48.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 +
             ((long)iStack_d0._M_current - (long)local_d8 >> 3) * 0x3c +
             ((long)iStack_b0._M_current - (long)local_b8 >> 3) * 6 + 3);
  PacketBuilder::AddChar(&local_98,(int)((ulong)((long)iStack_d0._M_current - (long)local_d8) >> 3))
  ;
  PacketBuilder::AddByte(&local_98,0xff);
  iVar4._M_current = iStack_d0._M_current;
  if (local_d8 != iStack_d0._M_current) {
    ppCVar11 = local_d8;
    do {
      this_00 = *ppCVar11;
      (*(this_00->super_Command_Source)._vptr_Command_Source[2])(&local_68,this_00);
      PacketBuilder::AddBreakString(&local_98,&local_68,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      PacketBuilder::AddShort(&local_98,this_00->player->id);
      PacketBuilder::AddShort(&local_98,(int)this_00->mapid);
      PacketBuilder::AddShort(&local_98,(uint)this_00->x);
      PacketBuilder::AddShort(&local_98,(uint)this_00->y);
      PacketBuilder::AddChar(&local_98,(uint)this_00->direction);
      PacketBuilder::AddChar(&local_98,6);
      PaddedGuildTag_abi_cxx11_(&local_68,this_00);
      PacketBuilder::AddString(&local_98,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      PacketBuilder::AddChar(&local_98,(uint)this_00->level);
      PacketBuilder::AddChar(&local_98,(uint)this_00->gender);
      PacketBuilder::AddChar(&local_98,(uint)this_00->hairstyle);
      PacketBuilder::AddChar(&local_98,(uint)this_00->haircolor);
      PacketBuilder::AddChar(&local_98,(uint)this_00->race);
      PacketBuilder::AddShort(&local_98,this_00->maxhp);
      PacketBuilder::AddShort(&local_98,this_00->hp);
      PacketBuilder::AddShort(&local_98,this_00->maxtp);
      PacketBuilder::AddShort(&local_98,this_00->tp);
      AddPaperdollData(this_00,&local_98,"B000A0HSW");
      PacketBuilder::AddChar(&local_98,(uint)this_00->sitting);
      PacketBuilder::AddChar(&local_98,this_00->hidden & 1);
      PacketBuilder::AddByte(&local_98,0xff);
      ppCVar11 = ppCVar11 + 1;
    } while (ppCVar11 != iVar4._M_current);
  }
  iVar5._M_current = iStack_b0._M_current;
  if (local_b8 != iStack_b0._M_current) {
    ppNVar14 = local_b8;
    do {
      pNVar2 = *ppNVar14;
      PacketBuilder::AddChar(&local_98,(uint)pNVar2->index);
      PacketBuilder::AddShort(&local_98,pNVar2->id);
      PacketBuilder::AddChar(&local_98,(uint)pNVar2->x);
      PacketBuilder::AddChar(&local_98,(uint)pNVar2->y);
      PacketBuilder::AddChar(&local_98,(uint)pNVar2->direction);
      ppNVar14 = ppNVar14 + 1;
    } while (ppNVar14 != iVar5._M_current);
  }
  PacketBuilder::AddByte(&local_98,0xff);
  psVar6 = local_48.
           super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar12 = local_48.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar3 = (psVar12->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (psVar12->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      PacketBuilder::AddShort(&local_98,(int)peVar3->uid);
      PacketBuilder::AddShort(&local_98,(int)peVar3->id);
      PacketBuilder::AddChar(&local_98,(uint)peVar3->x);
      PacketBuilder::AddChar(&local_98,(uint)peVar3->y);
      PacketBuilder::AddThree(&local_98,peVar3->amount);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar6);
  }
  Player::Send(this->player,&local_98);
  PacketBuilder::~PacketBuilder(&local_98);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
            (&local_48);
  if (local_b8 != (NPC **)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (local_d8 != (Character **)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return;
}

Assistant:

void Character::Refresh()
{
	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(this->map->characters, character)
	{
		if (this->InRange(character))
		{
			updatecharacters.push_back(character);
		}
	}

	UTIL_FOREACH(this->map->npcs, npc)
	{
		if (this->InRange(npc) && npc->alive)
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(this->map->items, item)
	{
		if (this->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder builder(PACKET_REFRESH, PACKET_REPLY, 3 + updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);
	builder.AddChar(updatecharacters.size()); // Number of players
	builder.AddByte(255);

	UTIL_FOREACH(updatecharacters, character)
	{
		builder.AddBreakString(character->SourceName());
		builder.AddShort(character->PlayerID());
		builder.AddShort(character->mapid);
		builder.AddShort(character->x);
		builder.AddShort(character->y);
		builder.AddChar(character->direction);
		builder.AddChar(6); // ?
		builder.AddString(character->PaddedGuildTag());
		builder.AddChar(character->level);
		builder.AddChar(character->gender);
		builder.AddChar(character->hairstyle);
		builder.AddChar(character->haircolor);
		builder.AddChar(character->race);
		builder.AddShort(character->maxhp);
		builder.AddShort(character->hp);
		builder.AddShort(character->maxtp);
		builder.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(builder, "B000A0HSW");

		builder.AddChar(character->sitting);
		builder.AddChar(character->IsHideInvisible());
		builder.AddByte(255);
	}

	UTIL_FOREACH(updatenpcs, npc)
	{
		builder.AddChar(npc->index);
		builder.AddShort(npc->id);
		builder.AddChar(npc->x);
		builder.AddChar(npc->y);
		builder.AddChar(npc->direction);
	}

	builder.AddByte(255);

	UTIL_FOREACH(updateitems, item)
	{
		builder.AddShort(item->uid);
		builder.AddShort(item->id);
		builder.AddChar(item->x);
		builder.AddChar(item->y);
		builder.AddThree(item->amount);
	}

	this->Send(builder);
}